

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_bandpre.c
# Opt level: O0

int ARKBandPrecGetWorkSpace(void *arkode_mem,long *lenrwBP,long *leniwBP)

{
  int iVar1;
  long *in_RDX;
  long *in_RSI;
  int retval;
  long liw;
  long lrw;
  sunindextype liw1;
  sunindextype lrw1;
  ARKBandPrecData pdata;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  ARKodeMem *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  void *in_stack_ffffffffffffffb8;
  long local_40;
  long local_38;
  long local_30;
  ARKodeMem local_28;
  long *local_20;
  long *local_18;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_4 = arkLs_AccessARKODELMem
                      (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8
                       ,(ARKLsMem *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  if (local_4 == 0) {
    if (*(long *)(local_30 + 0xe8) == 0) {
      arkProcessError(local_28,-5,0xd3,"ARKBandPrecGetWorkSpace",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bandpre.c"
                      ,"Band preconditioner memory is NULL. ARKBandPrecInit must be called.");
      local_4 = -5;
    }
    else {
      local_38 = *(long *)(local_30 + 0xe8);
      *local_20 = 4;
      *local_18 = 0;
      if (local_28->tempv1->ops->nvspace !=
          (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
        N_VSpace(local_28->tempv1,&local_40,&stack0xffffffffffffffb8);
        *local_20 = (long)in_stack_ffffffffffffffb8 * 2 + *local_20;
        *local_18 = local_40 * 2 + *local_18;
      }
      if ((*(long *)(*(long *)(*(long *)(local_38 + 0x18) + 8) + 0x48) != 0) &&
         (iVar1 = SUNMatSpace(*(undefined8 *)(local_38 + 0x18),&stack0xffffffffffffffb0,
                              &stack0xffffffffffffffa8), iVar1 == 0)) {
        *local_20 = (long)in_stack_ffffffffffffffa8 + *local_20;
        *local_18 = (long)(in_stack_ffffffffffffffb0 + *local_18);
      }
      if ((*(long *)(*(long *)(*(long *)(local_38 + 0x20) + 8) + 0x48) != 0) &&
         (iVar1 = SUNMatSpace(*(undefined8 *)(local_38 + 0x20),&stack0xffffffffffffffb0,
                              &stack0xffffffffffffffa8), iVar1 == 0)) {
        *local_20 = (long)in_stack_ffffffffffffffa8 + *local_20;
        *local_18 = (long)(in_stack_ffffffffffffffb0 + *local_18);
      }
      if ((*(long *)(*(long *)(*(long *)(local_38 + 0x28) + 8) + 0x60) != 0) &&
         (iVar1 = SUNLinSolSpace(*(undefined8 *)(local_38 + 0x28),&stack0xffffffffffffffb0,
                                 &stack0xffffffffffffffa8), iVar1 == 0)) {
        *local_20 = (long)in_stack_ffffffffffffffa8 + *local_20;
        *local_18 = (long)(in_stack_ffffffffffffffb0 + *local_18);
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int ARKBandPrecGetWorkSpace(void* arkode_mem, long int* lenrwBP, long int* leniwBP)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  ARKBandPrecData pdata;
  sunindextype lrw1, liw1;
  long int lrw, liw;
  int retval;

  /* access ARKodeMem and ARKLsMem structures */
  retval = arkLs_AccessARKODELMem(arkode_mem, __func__, &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Return immediately if ARKBandPrecData is NULL */
  if (arkls_mem->P_data == NULL)
  {
    arkProcessError(ark_mem, ARKLS_PMEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_BP_PMEM_NULL);
    return (ARKLS_PMEM_NULL);
  }
  pdata = (ARKBandPrecData)arkls_mem->P_data;

  /* sum space requirements for all objects in pdata */
  *leniwBP = 4;
  *lenrwBP = 0;
  if (ark_mem->tempv1->ops->nvspace)
  {
    N_VSpace(ark_mem->tempv1, &lrw1, &liw1);
    *leniwBP += 2 * liw1;
    *lenrwBP += 2 * lrw1;
  }
  if (pdata->savedJ->ops->space)
  {
    retval = SUNMatSpace(pdata->savedJ, &lrw, &liw);
    if (retval == 0)
    {
      *leniwBP += liw;
      *lenrwBP += lrw;
    }
  }
  if (pdata->savedP->ops->space)
  {
    retval = SUNMatSpace(pdata->savedP, &lrw, &liw);
    if (retval == 0)
    {
      *leniwBP += liw;
      *lenrwBP += lrw;
    }
  }
  if (pdata->LS->ops->space)
  {
    retval = SUNLinSolSpace(pdata->LS, &lrw, &liw);
    if (retval == SUN_SUCCESS)
    {
      *leniwBP += liw;
      *lenrwBP += lrw;
    }
  }

  return (ARKLS_SUCCESS);
}